

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakWarningTest.cpp
# Opt level: O3

void __thiscall
TEST_MemoryLeakWarningGlobalDetectorTest_turnOffNewOverloadsNoThrowCausesNoAdditionalLeaks_Test::
testBody(TEST_MemoryLeakWarningGlobalDetectorTest_turnOffNewOverloadsNoThrowCausesNoAdditionalLeaks_Test
         *this)

{
  size_t sVar1;
  void *mem;
  void *mem_00;
  void *mem_01;
  UtestShell *pUVar2;
  size_t sVar3;
  TestTerminator *pTVar4;
  
  sVar1 = MemoryLeakDetector::totalMemoryLeaks
                    ((this->super_TEST_GROUP_CppUTestGroupMemoryLeakWarningGlobalDetectorTest).
                     detector,mem_leak_period_all);
  mem = operator_new(1,(nothrow_t *)&std::nothrow);
  mem_00 = operator_new__(10,(nothrow_t *)&std::nothrow);
  mem_01 = operator_new__(10);
  pUVar2 = UtestShell::getCurrent();
  sVar3 = MemoryLeakDetector::totalMemoryLeaks
                    ((this->super_TEST_GROUP_CppUTestGroupMemoryLeakWarningGlobalDetectorTest).
                     detector,mem_leak_period_all);
  pTVar4 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[0xe])
            (pUVar2,sVar1,sVar3,
             "LONGS_EQUAL(storedAmountOfLeaks, detector->totalMemoryLeaks(mem_leak_period_all)) failed"
             ,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakWarningTest.cpp"
             ,0x17f,pTVar4);
  operator_delete(mem,(nothrow_t *)&std::nothrow);
  operator_delete__(mem_00,(nothrow_t *)&std::nothrow);
  operator_delete__(mem_01,(nothrow_t *)&std::nothrow);
  return;
}

Assistant:

TEST(MemoryLeakWarningGlobalDetectorTest, turnOffNewOverloadsNoThrowCausesNoAdditionalLeaks)
{
#undef new
    size_t storedAmountOfLeaks = detector->totalMemoryLeaks(mem_leak_period_all);

    char* nonMemoryNoThrow = new (std::nothrow) char;
    char* nonArrayMemoryNoThrow = new (std::nothrow) char[10];
    char* nonArrayMemoryThrow = new char[10];

    LONGS_EQUAL(storedAmountOfLeaks, detector->totalMemoryLeaks(mem_leak_period_all));

    ::operator delete(nonMemoryNoThrow, std::nothrow);
    ::operator delete[](nonArrayMemoryNoThrow, std::nothrow);
    ::operator delete[](nonArrayMemoryThrow, std::nothrow);
#ifdef CPPUTEST_USE_NEW_MACROS
    #include "CppUTest/MemoryLeakDetectorNewMacros.h"
#endif
}